

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoadingInstance.cpp
# Opt level: O3

void __thiscall LoadingInstance::Build(LoadingInstance *this,Instance *instance)

{
  pointer *ppTVar1;
  pointer pTVar2;
  iterator __position;
  Task TVar3;
  istream *this_00;
  int iVar4;
  int val;
  int numerOfTaks;
  int local_38;
  int local_34;
  Task local_30;
  
  this_00 = (istream *)std::istream::operator>>((istream *)this->in,&instance->numProcessors);
  std::istream::operator>>(this_00,&local_34);
  pTVar2 = (instance->tasks).super__Vector_base<Task,_std::allocator<Task>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pTVar2 != (instance->tasks).super__Vector_base<Task,_std::allocator<Task>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    (instance->tasks).super__Vector_base<Task,_std::allocator<Task>_>._M_impl.
    super__Vector_impl_data._M_finish = pTVar2;
  }
  local_38 = 0;
  if (0 < local_34) {
    iVar4 = 0;
    do {
      std::istream::operator>>((istream *)this->in,&local_38);
      local_30.length = local_38;
      __position._M_current =
           (instance->tasks).super__Vector_base<Task,_std::allocator<Task>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_30.id = iVar4;
      if (__position._M_current ==
          (instance->tasks).super__Vector_base<Task,_std::allocator<Task>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<Task,_std::allocator<Task>_>::_M_realloc_insert<Task>
                  (&instance->tasks,__position,&local_30);
      }
      else {
        TVar3.id = iVar4;
        TVar3.length = local_38;
        *__position._M_current = TVar3;
        ppTVar1 = &(instance->tasks).super__Vector_base<Task,_std::allocator<Task>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppTVar1 = *ppTVar1 + 1;
      }
      iVar4 = iVar4 + 1;
    } while (iVar4 < local_34);
  }
  return;
}

Assistant:

void LoadingInstance::Build(Instance& instance){
	int numerOfTaks;
	(*in) >> instance.numProcessors >> numerOfTaks;
	if(!instance.tasks.empty()) instance.tasks.clear();
	//if previous Instance was already built, replace it's old content

	int val = 0;
	for(int i = 0; i < numerOfTaks; i++){
		(*in) >> val;
		instance.tasks.push_back(Task(val, i));
	}
}